

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

TRef snap_dedup(jit_State *J,SnapEntry *map,MSize nmax,IRRef ref)

{
  uint *puVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if (nmax == uVar2) {
      return 0;
    }
    puVar1 = map + uVar2;
    uVar2 = uVar2 + 1;
  } while ((*puVar1 & 0xffff) != ref);
  return J->slot[*puVar1 >> 0x18] & 0xffecffff;
}

Assistant:

static TRef snap_dedup(jit_State *J, SnapEntry *map, MSize nmax, IRRef ref)
{
  MSize j;
  for (j = 0; j < nmax; j++)
    if (snap_ref(map[j]) == ref)
      return J->slot[snap_slot(map[j])] & ~(SNAP_KEYINDEX|SNAP_CONT|SNAP_FRAME);
  return 0;
}